

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

optional<pbrt::CameraRay> * __thiscall
pbrt::OrthographicCamera::GenerateRay
          (optional<pbrt::CameraRay> *__return_storage_ptr__,OrthographicCamera *this,
          CameraSample sample,SampledWavelengths *lambda)

{
  float fVar1;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar5 [56];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar6 [16];
  Point3<float> PVar7;
  Point3f PVar8;
  Vector3<float> VVar9;
  Ray local_b0;
  Tuple2<pbrt::Point2,_float> local_88;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  Tuple2<pbrt::Point2,_float> local_60;
  undefined4 local_58;
  anon_struct_8_0_00000001_for___align local_50;
  float fStack_48;
  float fStack_44;
  float fStack_40;
  undefined8 uStack_3c;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_30;
  SampledSpectrum local_28;
  
  auVar5 = ZEXT856(0);
  local_60 = sample.pFilm.super_Tuple2<pbrt::Point2,_float>;
  local_58 = 0;
  PVar7 = Transform::operator()
                    (&(this->super_ProjectiveCamera).cameraFromRaster,(Point3<float> *)&local_60);
  local_b0.o.super_Tuple3<pbrt::Point3,_float>.z = PVar7.super_Tuple3<pbrt::Point3,_float>.z;
  auVar2._0_8_ = PVar7.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar2._8_56_ = auVar5;
  local_b0.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )(this->super_ProjectiveCamera).super_CameraBase.medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(sample.time *
                                         (this->super_ProjectiveCamera).super_CameraBase.
                                         shutterClose)),ZEXT416((uint)(1.0 - sample.time)),
                           ZEXT416((uint)(this->super_ProjectiveCamera).super_CameraBase.shutterOpen
                                  ));
  local_b0.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar2._0_16_);
  local_b0.d.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  local_b0.d.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  local_b0.d.super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
  local_b0.time = auVar6._0_4_;
  fVar1 = (this->super_ProjectiveCamera).lensRadius;
  if (0.0 < fVar1) {
    local_78 = ZEXT416((uint)fVar1);
    local_88 = (Tuple2<pbrt::Point2,_float>)SampleUniformDiskConcentric(&sample.pLens);
    auVar5 = ZEXT856(0);
    uStack_80 = extraout_XMM0_Qb;
    PVar8 = Ray::operator()(&local_b0,
                            (this->super_ProjectiveCamera).focalDistance /
                            local_b0.d.super_Tuple3<pbrt::Vector3,_float>.z);
    fStack_48 = PVar8.super_Tuple3<pbrt::Point3,_float>.z;
    auVar3._0_8_ = PVar8.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar3._8_56_ = auVar5;
    auVar6._0_4_ = (float)local_78._0_4_ * local_88.x;
    auVar6._4_4_ = (float)local_78._0_4_ * local_88.y;
    auVar6._8_4_ = (float)local_78._0_4_ * (float)uStack_80;
    auVar6._12_4_ = (float)local_78._0_4_ * uStack_80._4_4_;
    local_b0.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar6);
    local_b0.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
    auVar6 = vsubps_avx(auVar3._0_16_,auVar6);
    auVar5 = ZEXT856(auVar6._8_8_);
    local_50 = (anon_struct_8_0_00000001_for___align)vmovlps_avx(auVar6);
    VVar9 = Normalize<float>((Vector3<float> *)&local_50);
    local_b0.d.super_Tuple3<pbrt::Vector3,_float>.z = VVar9.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar4._0_8_ = VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar4._8_56_ = auVar5;
    local_b0.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar4._0_16_);
  }
  CameraTransform::RenderFromCamera((Ray *)&local_50,(CameraTransform *)this,&local_b0);
  SampledSpectrum::SampledSpectrum(&local_28,1.0);
  __return_storage_ptr__->set = true;
  (__return_storage_ptr__->optionalValue).__align = local_50;
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 8) = CONCAT44(fStack_44,fStack_48);
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0xc) = CONCAT44(fStack_40,fStack_44);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x14) = uStack_3c;
  *(uintptr_t *)((long)&__return_storage_ptr__->optionalValue + 0x20) = local_30.bits;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) =
       local_28.values.values._0_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
       local_28.values.values._8_8_;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<CameraRay> OrthographicCamera::GenerateRay(
    CameraSample sample, SampledWavelengths &lambda) const {
    // Compute raster and camera sample positions
    Point3f pFilm = Point3f(sample.pFilm.x, sample.pFilm.y, 0);
    Point3f pCamera = cameraFromRaster(pFilm);

    Ray ray(pCamera, Vector3f(0, 0, 1), SampleTime(sample.time), medium);
    // Modify ray for depth of field
    if (lensRadius > 0) {
        // Sample point on lens
        Point2f pLens = lensRadius * SampleUniformDiskConcentric(sample.pLens);

        // Compute point on plane of focus
        Float ft = focalDistance / ray.d.z;
        Point3f pFocus = ray(ft);

        // Update ray for effect of lens
        ray.o = Point3f(pLens.x, pLens.y, 0);
        ray.d = Normalize(pFocus - ray.o);
    }

    return CameraRay{RenderFromCamera(ray)};
}